

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

int get_trust(CHAR_DATA *ch)

{
  bool bVar1;
  long in_RDI;
  CHAR_DATA *in_stack_ffffffffffffffe8;
  long local_10;
  int local_4;
  
  local_10 = in_RDI;
  if ((*(long *)(in_RDI + 0x80) != 0) && (*(long *)(*(long *)(in_RDI + 0x80) + 0x18) != 0)) {
    local_10 = *(long *)(*(long *)(in_RDI + 0x80) + 0x18);
  }
  if (*(short *)(local_10 + 0x13a) == 0) {
    bVar1 = is_npc(in_stack_ffffffffffffffe8);
    if ((bVar1) && (0x32 < *(short *)(local_10 + 0x138))) {
      local_4 = 0x32;
    }
    else {
      local_4 = (int)*(short *)(local_10 + 0x138);
    }
  }
  else {
    local_4 = (int)*(short *)(local_10 + 0x13a);
  }
  return local_4;
}

Assistant:

int get_trust(CHAR_DATA *ch)
{
	if (ch->desc != nullptr && ch->desc->original != nullptr)
		ch = ch->desc->original;

	if (ch->trust)
		return ch->trust;

	if (is_npc(ch) && ch->level >= LEVEL_HERO)
		return LEVEL_HERO - 1;
	else
		return ch->level;
}